

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a64rapass.cpp
# Opt level: O3

Error __thiscall
asmjit::v1_14::a64::ARMRAPass::_rewrite(ARMRAPass *this,BaseNode *first,BaseNode *stop)

{
  BaseNode BVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  BaseNode *pBVar5;
  long *plVar6;
  BaseBuilder *pBVar7;
  long lVar8;
  byte *pbVar9;
  uint uVar10;
  bool bVar11;
  uint32_t uVar12;
  Error EVar13;
  undefined8 extraout_RAX;
  ulong uVar14;
  uint uVar15;
  InstId instId;
  ulong uVar16;
  long lVar17;
  uint uVar18;
  GpX dst;
  GpX base;
  Operand_ local_88;
  BaseNode *local_70;
  Operand_ local_68;
  Operand_ local_58;
  undefined8 local_40;
  long local_38;
  
  if (first != stop) {
    uVar3 = *(uint *)&(this->super_BaseRAPass).super_FuncPass.super_Pass._cb[1].super_BaseEmitter.
                      _logger;
    local_70 = stop;
    do {
      pBVar5 = *(BaseNode **)(first + 8);
      if (((byte)first[0x11] & 0x20) != 0) {
        plVar6 = *(long **)(first + 0x20);
        BVar1 = first[0x12];
        if (plVar6 != (long *)0x0) {
          uVar15 = *(uint *)(plVar6 + 2);
          if ((ulong)uVar15 != 0) {
            uVar16 = 0;
            do {
              lVar17 = uVar16 * 0x20;
              uVar18 = *(uint *)((long)plVar6 + lVar17 + 100);
              if (uVar18 != 0) {
                bVar2 = *(byte *)((long)plVar6 + lVar17 + 0x5a);
                do {
                  uVar10 = 0;
                  if (uVar18 != 0) {
                    for (; (uVar18 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
                    }
                  }
                  if (0x19 < uVar10) {
                    _rewrite();
                    goto LAB_0013726a;
                  }
                  *(uint *)(first + (ulong)uVar10 * 4 + 0x3c) = (uint)bVar2;
                  uVar18 = uVar18 - 1 & uVar18;
                } while (uVar18 != 0);
              }
              uVar18 = *(uint *)(plVar6 + uVar16 * 4 + 0xd);
              if (uVar18 != 0) {
                bVar2 = *(byte *)((long)plVar6 + lVar17 + 0x5b);
                do {
                  uVar10 = 0;
                  if (uVar18 != 0) {
                    for (; (uVar18 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
                    }
                  }
                  if (0x19 < uVar10) {
LAB_0013726a:
                    _rewrite();
                    return 0x1e;
                  }
                  *(uint *)(first + (ulong)uVar10 * 4 + 0x3c) = (uint)bVar2;
                  uVar18 = uVar18 - 1 & uVar18;
                } while (uVar18 != 0);
              }
              uVar16 = uVar16 + 1;
            } while (uVar16 != uVar15);
          }
          *(undefined8 *)(first + 0x20) = 0;
          stop = local_70;
          if (first[0x10] == (BaseNode)0x11) {
            local_38 = *plVar6;
            bVar11 = BaseRAPass::isNextTo
                               (&this->super_BaseRAPass,first,
                                (BaseNode *)((this->super_BaseRAPass)._func)->_exitNode);
            if (!bVar11) {
              ((this->super_BaseRAPass).super_FuncPass.super_Pass._cb)->_cursor =
                   *(BaseNode **)first;
              local_88._baseId = *(uint32_t *)(((this->super_BaseRAPass)._func)->_exitNode + 0x30);
              local_88._signature._bits = 5;
              local_88._data[0] = 0;
              local_88._data[1] = 0;
              EVar13 = (*(this->super_BaseRAPass).super_FuncPass.super_Pass._vptr_Pass[0xd])
                                 (this,&local_88);
              if (EVar13 != 0) {
                return EVar13;
              }
            }
            local_40 = *(undefined8 *)first;
            BaseBuilder::removeNode((this->super_BaseRAPass).super_FuncPass.super_Pass._cb,first);
            *(undefined8 *)(local_38 + 0x18) = local_40;
            stop = local_70;
          }
        }
        if (BVar1 != (BaseNode)0x0) {
          pBVar7 = (this->super_BaseRAPass).super_FuncPass.super_Pass._cb;
          lVar17 = 0;
          do {
            if ((*(uint *)(first + lVar17 + 0x40) & 0x2007) == 0x2002) {
              uVar15 = *(int *)(first + lVar17 + 0x44) - 0x100;
              if (uVar3 <= uVar15) {
                return 0x1e;
              }
              if (*(uint *)&pBVar7[1].super_BaseEmitter._logger <= uVar15) {
                _rewrite();
LAB_0013727b:
                _rewrite();
                return 0x2c;
              }
              lVar8 = *(long *)((long)(&(pBVar7[1].super_BaseEmitter._code)->_environment)[uVar15] +
                               0x28);
              if (lVar8 == 0) goto LAB_0013727b;
              pbVar9 = *(byte **)(lVar8 + 0x18);
              iVar4 = *(int *)(pbVar9 + 0x10);
              uVar15 = (this->super_BaseRAPass)._sp.super_Operand.super_Operand_._signature._bits;
              *(uint *)(first + lVar17 + 0x44) = (uint)*pbVar9;
              *(uint *)(first + lVar17 + 0x40) =
                   *(uint *)(first + lVar17 + 0x40) & 0xffffdf02 | uVar15 & 0xf8;
              *(int *)(first + lVar17 + 0x4c) = *(int *)(first + lVar17 + 0x4c) + iVar4;
            }
            lVar17 = lVar17 + 0x10;
          } while ((ulong)(byte)BVar1 * 0x10 != lVar17);
        }
        if ((*(short *)(first + 0x30) == 6) && (first[0x12] == (BaseNode)0x2)) {
          if ((byte)first[0x13] < 2) {
            _rewrite();
LAB_0013728c:
            _rewrite();
LAB_00137291:
            _rewrite();
LAB_00137296:
            _rewrite();
LAB_0013729b:
            _rewrite();
LAB_001372a0:
            _rewrite();
LAB_001372a5:
            _rewrite();
            __clang_call_terminate(extraout_RAX);
          }
          uVar15 = *(uint *)(first + 0x50);
          if ((uVar15 & 7) == 2) {
            uVar12 = *(uint32_t *)(first + 0x54);
            uVar16 = CONCAT44(uVar12,*(int *)(first + 0x5c));
            if ((uVar15 & 0xf8) != 0) {
              uVar16 = (long)*(int *)(first + 0x5c);
            }
            if ((uVar15 & 0x1ff8) == 0) {
              *(undefined4 *)(first + 0x30) = 0xf4;
              *(undefined8 *)(first + 0x50) = 4;
              *(int *)(first + 0x58) = (int)uVar16;
              *(int *)(first + 0x5c) = (int)(uVar16 >> 0x20);
            }
            else {
              if ((uVar15 & 0x1f00) != 0) {
                return 0x2c;
              }
              local_88._baseId = *(uint32_t *)(first + 0x44);
              local_88._signature._bits = 0x8000039;
              local_88._data[0] = 0;
              local_88._data[1] = 0;
              local_58._signature._bits = 0x8000039;
              local_58._data[0] = 0;
              local_58._data[1] = 0;
              instId = 3;
              if ((long)uVar16 < 0) {
                instId = 0x174;
              }
              uVar14 = -uVar16;
              if (0 < (long)uVar16) {
                uVar14 = uVar16;
              }
              *(InstId *)(first + 0x30) = instId;
              first[0x12] = (BaseNode)0x3;
              *(undefined4 *)(first + 0x50) = 0x8000039;
              *(undefined8 *)(first + 0x58) = 0;
              local_58._baseId = uVar12;
              if (first[0x13] == (BaseNode)0x2) goto LAB_0013728c;
              *(undefined8 *)(first + 0x60) = 4;
              uVar15 = (uint)uVar14;
              *(uint *)(first + 0x68) = uVar15;
              uVar12 = (uint32_t)(uVar14 >> 0x20);
              *(uint32_t *)(first + 0x6c) = uVar12;
              if ((uVar14 & 0xffffffffff000fff) != 0 && 0xfff < uVar14) {
                pBVar7 = (this->super_BaseRAPass).super_FuncPass.super_Pass._cb;
                pBVar7->_cursor = *(BaseNode **)first;
                if (0xffffff < uVar14) {
                  if (first[0x13] == (BaseNode)0x0) goto LAB_00137291;
                  local_68._signature._bits = 4;
                  local_68._baseId = 0;
                  local_68._data[0] = uVar15;
                  local_68._data[1] = uVar12;
                  EVar13 = BaseEmitter::_emitI(&pBVar7->super_BaseEmitter,0xf4,
                                               (Operand_ *)(first + 0x40),&local_68);
                  if (EVar13 != 0) {
                    return EVar13;
                  }
                  if (1 < (byte)first[0x13]) {
                    *(ulong *)(first + 0x50) = CONCAT44(local_58._baseId,local_58._signature._bits);
                    *(uint32_t (*) [2])(first + 0x58) = local_58._data;
                    if (first[0x13] == (BaseNode)0x2) goto LAB_001372a5;
                    *(ulong *)(first + 0x60) = CONCAT44(local_88._baseId,local_88._signature._bits);
                    *(uint32_t *)(first + 0x68) = local_88._data[0];
                    uVar12 = local_88._data[1];
                    goto LAB_001371a8;
                  }
                  goto LAB_0013729b;
                }
                local_68._data[0] = uVar15 & 0xfff;
                local_68._signature._bits = 4;
                local_68._baseId = 0;
                local_68._data[1] = 0;
                EVar13 = BaseEmitter::_emitI(&pBVar7->super_BaseEmitter,instId,&local_88,&local_58,
                                             &local_68);
                if (EVar13 != 0) {
                  return EVar13;
                }
                if ((byte)first[0x13] < 2) goto LAB_00137296;
                *(ulong *)(first + 0x50) = CONCAT44(local_88._baseId,local_88._signature._bits);
                *(uint32_t (*) [2])(first + 0x58) = local_88._data;
                if (first[0x13] != (BaseNode)0x2) {
                  *(undefined8 *)(first + 0x60) = 4;
                  *(uint *)(first + 0x68) = uVar15 & 0xfff000;
                  uVar12 = 0;
LAB_001371a8:
                  *(uint32_t *)(first + 0x6c) = uVar12;
                  stop = local_70;
                  goto LAB_001371ac;
                }
                goto LAB_001372a0;
              }
            }
          }
        }
      }
LAB_001371ac:
      first = pBVar5;
    } while (pBVar5 != stop);
  }
  return 0;
}

Assistant:

ASMJIT_FAVOR_SPEED Error ARMRAPass::_rewrite(BaseNode* first, BaseNode* stop) noexcept {
  uint32_t virtCount = cc()->_vRegArray.size();

  BaseNode* node = first;
  while (node != stop) {
    BaseNode* next = node->next();
    if (node->isInst()) {
      InstNode* inst = node->as<InstNode>();
      RAInst* raInst = node->passData<RAInst>();

      Operand* operands = inst->operands();
      uint32_t opCount = inst->opCount();

      uint32_t i;

      // Rewrite virtual registers into physical registers.
      if (raInst) {
        // If the instruction contains pass data (raInst) then it was a subject
        // for register allocation and must be rewritten to use physical regs.
        RATiedReg* tiedRegs = raInst->tiedRegs();
        uint32_t tiedCount = raInst->tiedCount();

        for (i = 0; i < tiedCount; i++) {
          RATiedReg* tiedReg = &tiedRegs[i];

          Support::BitWordIterator<uint32_t> useIt(tiedReg->useRewriteMask());
          uint32_t useId = tiedReg->useId();
          while (useIt.hasNext())
            inst->rewriteIdAtIndex(useIt.next(), useId);

          Support::BitWordIterator<uint32_t> outIt(tiedReg->outRewriteMask());
          uint32_t outId = tiedReg->outId();
          while (outIt.hasNext())
            inst->rewriteIdAtIndex(outIt.next(), outId);
        }

        // This data is allocated by Zone passed to `runOnFunction()`, which
        // will be reset after the RA pass finishes. So reset this data to
        // prevent having a dead pointer after the RA pass is complete.
        node->resetPassData();

        if (ASMJIT_UNLIKELY(node->type() != NodeType::kInst)) {
          // FuncRet terminates the flow, it must either be removed if the exit
          // label is next to it (optimization) or patched to an architecture
          // dependent jump instruction that jumps to the function's exit before
          // the epilog.
          if (node->type() == NodeType::kFuncRet) {
            RABlock* block = raInst->block();
            if (!isNextTo(node, _func->exitNode())) {
              cc()->_setCursor(node->prev());
              ASMJIT_PROPAGATE(emitJump(_func->exitNode()->label()));
            }

            BaseNode* prev = node->prev();
            cc()->removeNode(node);
            block->setLast(prev);
          }
        }
      }

      // Rewrite stack slot addresses.
      for (i = 0; i < opCount; i++) {
        Operand& op = operands[i];
        if (op.isMem()) {
          BaseMem& mem = op.as<BaseMem>();
          if (mem.isRegHome()) {
            uint32_t virtIndex = Operand::virtIdToIndex(mem.baseId());
            if (ASMJIT_UNLIKELY(virtIndex >= virtCount))
              return DebugUtils::errored(kErrorInvalidVirtId);

            VirtReg* virtReg = cc()->virtRegByIndex(virtIndex);
            RAWorkReg* workReg = virtReg->workReg();
            ASMJIT_ASSERT(workReg != nullptr);

            RAStackSlot* slot = workReg->stackSlot();
            int32_t offset = slot->offset();

            mem._setBase(_sp.type(), slot->baseRegId());
            mem.clearRegHome();
            mem.addOffsetLo32(offset);
          }
        }
      }

      // Rewrite `loadAddressOf()` construct.
      if (inst->realId() == Inst::kIdAdr && inst->opCount() == 2 && inst->op(1).isMem()) {
        BaseMem mem = inst->op(1).as<BaseMem>();
        int64_t offset = mem.offset();

        if (!mem.hasBaseOrIndex()) {
          inst->setId(Inst::kIdMov);
          inst->setOp(1, Imm(offset));
        }
        else {
          if (mem.hasIndex())
            return DebugUtils::errored(kErrorInvalidAddressIndex);

          GpX dst(inst->op(0).as<Gp>().id());
          GpX base(mem.baseId());

          InstId arithInstId = offset < 0 ? Inst::kIdSub : Inst::kIdAdd;
          uint64_t absOffset = offset < 0 ? Support::neg(uint64_t(offset)) : uint64_t(offset);

          inst->setId(arithInstId);
          inst->setOpCount(3);
          inst->setOp(1, base);
          inst->setOp(2, Imm(absOffset));

          // Use two operations if the offset cannot be encoded with ADD/SUB.
          if (absOffset > 0xFFFu && (absOffset & ~uint64_t(0xFFF000u)) != 0) {
            if (absOffset <= 0xFFFFFFu) {
              cc()->_setCursor(inst->prev());
              ASMJIT_PROPAGATE(cc()->emit(arithInstId, dst, base, Imm(absOffset & 0xFFFu)));

              inst->setOp(1, dst);
              inst->setOp(2, Imm(absOffset & 0xFFF000u));
            }
            else {
              cc()->_setCursor(inst->prev());
              ASMJIT_PROPAGATE(cc()->emit(Inst::kIdMov, inst->op(0), Imm(absOffset)));

              inst->setOp(1, base);
              inst->setOp(2, dst);
            }
          }
        }
      }
    }

    node = next;
  }

  return kErrorOk;
}